

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_libc.c
# Opt level: O1

err_t Open(filestream *p,tchar_t *URL,int Flags)

{
  int iVar1;
  int iVar2;
  stat file_stats;
  stat64 local_b0;
  
  if (p->fd != -1) {
    close(p->fd);
  }
  p->Length = -1;
  p->fd = -1;
  if ((URL != (tchar_t *)0x0) && (*URL != '\0')) {
    iVar1 = 1;
    if ((Flags & 3U) != 2) {
      iVar1 = (uint)((Flags & 3U) != 1) * 2;
    }
    iVar2 = iVar1 + 0x240;
    if ((Flags & 4U) == 0) {
      iVar2 = iVar1;
    }
    iVar1 = open64(URL,iVar2,0x1a4);
    p->fd = iVar1;
    if (iVar1 == -1) {
      if ((Flags & 0x28U) == 0) {
        NodeReportError(p,(node *)0x0,0x5f525245,-8,URL);
      }
    }
    else {
      tcscpy_s(p->URL,0x100,URL);
      iVar2 = stat64(URL,&local_b0);
      if (iVar2 == 0) {
        p->Length = local_b0.st_size;
      }
    }
    if (iVar1 == -1) {
      return -8;
    }
  }
  return 0;
}

Assistant:

static err_t Open(filestream* p, const tchar_t* URL, int Flags)
{
    if (p->fd != -1)
        close(p->fd);

    p->Length = INVALID_FILEPOS_T;
    p->fd = -1;

    if (URL && URL[0])
    {
        struct stat file_stats;
        int mode = 0;

        if (Flags & SFLAG_WRONLY && !(Flags & SFLAG_RDONLY))
            mode = O_WRONLY;
        else if (Flags & SFLAG_RDONLY && !(Flags & SFLAG_WRONLY))
            mode = O_RDONLY;
        else
            mode = O_RDWR;

        if (Flags & SFLAG_CREATE)
            mode |= O_CREAT|O_TRUNC;

        //TODO: verify it works with Unicode files too
        p->fd = open(URL, mode, _RW_ACCESS_FILE);
        if (p->fd == -1)
        {
            if ((Flags & (SFLAG_REOPEN|SFLAG_SILENT))==0)
                NodeReportError(p,NULL,ERR_ID,ERR_FILE_NOT_FOUND,URL);
            return ERR_FILE_NOT_FOUND;
        }

        tcscpy_s(p->URL,TSIZEOF(p->URL),URL);

        if (stat(URL, &file_stats) == 0)
            p->Length = file_stats.st_size;

    }
    return ERR_NONE;
}